

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void generic_mixed_endian(void)

{
  uint16_t uVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  uint32_t val;
  int32_t val_00;
  uint64_t uVar5;
  float fVar6;
  double val_01;
  undefined8 local_40;
  uint8_t buf [2];
  
  iVar3 = greatest_pre_test("generic_mixed_endian_u16_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_u16_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      uVar5 = random_unique();
      uVar1 = (uint16_t)uVar5;
      pack_le_u16(buf,uVar1);
      unpack_be_u16((uint16_t *)&local_40,buf);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x285;
      if ((uint16_t)local_40 != uVar1) {
        pack_be_u16(buf,uVar1);
        unpack_le_u16((uint16_t *)&local_40,buf);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x288;
        if ((uint16_t)local_40 != uVar1) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_001048a8;
        }
      }
      iVar3 = -1;
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_001048a8:
    greatest_post_test("generic_mixed_endian_u16_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_i16_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_i16_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      uVar5 = random_unique();
      uVar1 = (uint16_t)uVar5;
      pack_le_i16(buf,uVar1);
      unpack_be_i16((int16_t *)&local_40,buf);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x293;
      if ((uint16_t)local_40 != uVar1) {
        pack_be_i16(buf,uVar1);
        unpack_le_i16((int16_t *)&local_40,buf);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x296;
        if ((uint16_t)local_40 != uVar1) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_001049a0;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_001049a0:
    greatest_post_test("generic_mixed_endian_i16_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_u32_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_u32_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      uVar5 = random_unique();
      val = (uint32_t)uVar5;
      pack_le_u32(buf,val);
      unpack_be_u32((uint32_t *)&local_40,buf);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x2a1;
      if (CONCAT22(local_40._2_2_,(uint16_t)local_40) != val) {
        pack_be_u32(buf,val);
        unpack_le_u32((uint32_t *)&local_40,buf);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x2a4;
        if (CONCAT22(local_40._2_2_,(uint16_t)local_40) != val) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_00104a92;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_00104a92:
    greatest_post_test("generic_mixed_endian_u32_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_i32_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_i32_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      uVar5 = random_unique();
      val_00 = (int32_t)uVar5;
      pack_le_i32(buf,val_00);
      unpack_be_i32((int32_t *)&local_40,buf);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x2af;
      if (CONCAT22(local_40._2_2_,(uint16_t)local_40) != val_00) {
        pack_be_i32(buf,val_00);
        unpack_le_i32((int32_t *)&local_40,buf);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x2b2;
        if (CONCAT22(local_40._2_2_,(uint16_t)local_40) != val_00) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_00104b84;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_00104b84:
    greatest_post_test("generic_mixed_endian_i32_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_u64_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_u64_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      uVar5 = random_unique();
      pack_le_u64(buf,uVar5);
      unpack_be_u64(&local_40,buf);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x2bd;
      if (uVar5 != CONCAT44(local_40._4_4_,CONCAT22(local_40._2_2_,(uint16_t)local_40))) {
        pack_be_u64(buf,uVar5);
        unpack_le_u64(&local_40,buf);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x2c0;
        if (uVar5 != CONCAT44(local_40._4_4_,CONCAT22(local_40._2_2_,(uint16_t)local_40))) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_00104c79;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_00104c79:
    greatest_post_test("generic_mixed_endian_u64_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_i64_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_i64_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      uVar5 = random_unique();
      pack_le_i64(buf,uVar5);
      unpack_be_i64(&local_40,buf);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x2cb;
      if (uVar5 != CONCAT44(local_40._4_4_,CONCAT22(local_40._2_2_,(uint16_t)local_40))) {
        pack_be_i64(buf,uVar5);
        unpack_le_i64(&local_40,buf);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x2ce;
        if (uVar5 != CONCAT44(local_40._4_4_,CONCAT22(local_40._2_2_,(uint16_t)local_40))) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_00104d6e;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_00104d6e:
    greatest_post_test("generic_mixed_endian_i64_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_f_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) != 0) {
      fprintf(_stdout,"  %s\n","generic_mixed_endian_f_should_not_match");
    }
  }
  else {
    iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar3 == 0) {
      uVar5 = random_unique();
      fVar6 = (float)uVar5;
      pack_le_f(buf,fVar6);
      unpack_be_f((float *)&local_40,buf);
      greatest_info.assertions = greatest_info.assertions + 1;
      uVar4 = 0x2d9;
      if (((float)CONCAT22(local_40._2_2_,(uint16_t)local_40) != fVar6) ||
         (NAN((float)CONCAT22(local_40._2_2_,(uint16_t)local_40)) || NAN(fVar6))) {
        pack_be_f(buf,fVar6);
        unpack_le_f((float *)&local_40,buf);
        greatest_info.assertions = greatest_info.assertions + 1;
        uVar4 = 0x2dc;
        if (((float)CONCAT22(local_40._2_2_,(uint16_t)local_40) != fVar6) ||
           (NAN((float)CONCAT22(local_40._2_2_,(uint16_t)local_40)) || NAN(fVar6))) {
          greatest_info.msg = (char *)0x0;
          iVar3 = 0;
          goto LAB_00104e9f;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
      ;
      iVar3 = -1;
      greatest_info.msg = "wrote == unpack";
      greatest_info.fail_line = uVar4;
    }
LAB_00104e9f:
    greatest_post_test("generic_mixed_endian_f_should_not_match",iVar3);
  }
  iVar3 = greatest_pre_test("generic_mixed_endian_d_should_not_match");
  if (iVar3 == 0) {
    if ((greatest_info.flags & 2) == 0) {
      return;
    }
    fprintf(_stdout,"  %s\n","generic_mixed_endian_d_should_not_match");
    return;
  }
  iVar3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar3 == 0) {
    fVar6 = random_float();
    val_01 = (double)fVar6;
    pack_le_d(buf,val_01);
    unpack_be_d((double *)&local_40,buf);
    greatest_info.assertions = greatest_info.assertions + 1;
    dVar2 = (double)CONCAT44(local_40._4_4_,CONCAT22(local_40._2_2_,(uint16_t)local_40));
    uVar4 = 0x2e7;
    if ((dVar2 != val_01) || (NAN(dVar2) || NAN(val_01))) {
      pack_be_d(buf,val_01);
      unpack_le_d((double *)&local_40,buf);
      greatest_info.assertions = greatest_info.assertions + 1;
      dVar2 = (double)CONCAT44(local_40._4_4_,CONCAT22(local_40._2_2_,(uint16_t)local_40));
      uVar4 = 0x2ea;
      if ((dVar2 != val_01) || (NAN(dVar2) || NAN(val_01))) {
        greatest_info.msg = (char *)0x0;
        iVar3 = 0;
        goto LAB_00104f81;
      }
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/JayKickliter[P]cursor/tests/test.c"
    ;
    iVar3 = -1;
    greatest_info.msg = "wrote == unpack";
    greatest_info.fail_line = uVar4;
  }
LAB_00104f81:
  greatest_post_test("generic_mixed_endian_d_should_not_match",iVar3);
  return;
}

Assistant:

SUITE(generic_mixed_endian) {
    RUN_TEST(generic_mixed_endian_u16_should_not_match);
    RUN_TEST(generic_mixed_endian_i16_should_not_match);
    RUN_TEST(generic_mixed_endian_u32_should_not_match);
    RUN_TEST(generic_mixed_endian_i32_should_not_match);
    RUN_TEST(generic_mixed_endian_u64_should_not_match);
    RUN_TEST(generic_mixed_endian_i64_should_not_match);
    RUN_TEST(generic_mixed_endian_f_should_not_match);
    RUN_TEST(generic_mixed_endian_d_should_not_match);
}